

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int planrobarm(PlannerType plannerType,char *envCfgFilename,bool forwardSearch)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  anaPlanner *this;
  ostream *poVar4;
  FILE *__stream;
  runtime_error *prVar5;
  ulong uVar6;
  char *__s;
  ulong uVar7;
  vector<int,_std::allocator<int>_> solution_stateIDs_V;
  MDPConfig MDPCfg;
  EnvironmentROBARM environment_robarm;
  void *local_1b8;
  void *pvStack_1b0;
  long local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  DiscreteSpaceInformation local_198 [8];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_198[0].StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198[0].StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198[0].StateID2IndexMapping.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198[0].fDeb = (FILE *)0x1;
  local_198[0]._vptr_DiscreteSpaceInformation = (_func_int **)calloc;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  cVar2 = EnvironmentROBARM::InitializeEnv((char *)local_198);
  if (cVar2 == '\0') {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"ERROR: InitializeEnv failed");
  }
  else {
    cVar2 = EnvironmentROBARM::InitializeMDPCfg((MDPConfig *)local_198);
    if (cVar2 != '\0') {
      local_1b8 = (void *)0x0;
      pvStack_1b0 = (void *)0x0;
      local_1a8 = 0;
      switch(plannerType) {
      case PLANNER_TYPE_ADSTAR:
        puts("Initializing ADPlanner...");
        this = (anaPlanner *)operator_new(0x98);
        ADPlanner::ADPlanner((ADPlanner *)this,local_198,forwardSearch);
        break;
      case PLANNER_TYPE_ARASTAR:
        puts("Initializing ARAPlanner...");
        this = (anaPlanner *)operator_new(0xa0);
        ARAPlanner::ARAPlanner((ARAPlanner *)this,local_198,forwardSearch);
        break;
      default:
        puts("Invalid planner type");
        this = (anaPlanner *)0x0;
        break;
      case PLANNER_TYPE_RSTAR:
        puts("Initializing RSTARPlanner...");
        this = (anaPlanner *)operator_new(0x68);
        RSTARPlanner::RSTARPlanner((RSTARPlanner *)this,local_198,forwardSearch);
        break;
      case PLANNER_TYPE_ANASTAR:
        puts("Initializing anaPlanner...");
        this = (anaPlanner *)operator_new(0x48);
        anaPlanner::anaPlanner(this,local_198,forwardSearch);
      }
      iVar3 = (**(code **)(*(long *)this + 0x28))(this,local_1a0);
      if (iVar3 == 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"ERROR: failed to set start state");
      }
      else {
        iVar3 = (**(code **)(*(long *)this + 0x20))(this,local_19c);
        if (iVar3 != 0) {
          puts("start planning...");
          iVar3 = (*(code *)**(undefined8 **)this)(0,this,&local_1b8);
          puts("done planning");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"size of solution=",0x11);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          __stream = fopen("sol.txt","w");
          if (__stream != (FILE *)0x0) {
            if (pvStack_1b0 != local_1b8) {
              uVar6 = 0;
              uVar7 = 1;
              do {
                EnvironmentROBARM::PrintState
                          ((int)local_198,SUB41(*(undefined4 *)((long)local_1b8 + uVar6 * 4),0),
                           (_IO_FILE *)0x1);
                bVar1 = uVar7 < (ulong)((long)pvStack_1b0 - (long)local_1b8 >> 2);
                uVar6 = uVar7;
                uVar7 = (ulong)((int)uVar7 + 1);
              } while (bVar1);
            }
            fclose(__stream);
            __s = "Solution is found";
            if (iVar3 == 0) {
              __s = "Solution does not exist";
            }
            puts(__s);
            fflush((FILE *)0x0);
            (**(code **)(*(long *)this + 0xa0))(this);
            if (local_1b8 != (void *)0x0) {
              operator_delete(local_1b8,local_1a8 - (long)local_1b8);
            }
            EnvironmentROBARM::~EnvironmentROBARM((EnvironmentROBARM *)local_198);
            return iVar3;
          }
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"ERROR: could not open solution file");
          *(undefined ***)prVar5 = &PTR__runtime_error_0010ec48;
          __cxa_throw(prVar5,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"ERROR: failed to set goal state");
      }
      *(undefined ***)prVar5 = &PTR__runtime_error_0010ec48;
      __cxa_throw(prVar5,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"ERROR: InitializeMDPCfg failed");
  }
  *(undefined ***)prVar5 = &PTR__runtime_error_0010ec48;
  __cxa_throw(prVar5,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int planrobarm(PlannerType plannerType, char* envCfgFilename, bool forwardSearch)
{
    int bRet = 0;
    double allocated_time_secs = 5.0; //in seconds
    MDPConfig MDPCfg;
    bool bforwardsearch = forwardSearch;

    //Initialize Environment (should be called before initializing anything else)
    EnvironmentROBARM environment_robarm;
    if (!environment_robarm.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //Initialize MDP Info
    if (!environment_robarm.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    //srand(1);

    //plan a path
    vector<int> solution_stateIDs_V;

    SBPLPlanner* planner = NULL;
    switch (plannerType) {
    case PLANNER_TYPE_ARASTAR:
        printf("Initializing ARAPlanner...\n");
        planner = new ARAPlanner(&environment_robarm, bforwardsearch);
        break;
    case PLANNER_TYPE_ADSTAR:
        printf("Initializing ADPlanner...\n");
        planner = new ADPlanner(&environment_robarm, bforwardsearch);
        break;
    case PLANNER_TYPE_RSTAR:
        printf("Initializing RSTARPlanner...\n");
        planner = new RSTARPlanner(&environment_robarm, bforwardsearch);
        break;
    case PLANNER_TYPE_ANASTAR:
        printf("Initializing anaPlanner...\n");
        planner = new anaPlanner(&environment_robarm, bforwardsearch);
        break;
    default:
        printf("Invalid planner type\n");
        break;
    }

    if (planner->set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }

    if (planner->set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    printf("start planning...\n");
    bRet = planner->replan(allocated_time_secs, &solution_stateIDs_V);
    printf("done planning\n");
    std::cout << "size of solution=" << solution_stateIDs_V.size() << std::endl;

    const char* sol = "sol.txt";
    FILE* fSol = fopen(sol, "w");
    if (fSol == NULL) {
        throw SBPL_Exception("ERROR: could not open solution file");
    }
    for (unsigned int i = 0; i < solution_stateIDs_V.size(); i++) {
        environment_robarm.PrintState(solution_stateIDs_V[i], true, fSol);
    }
    fclose(fSol);

    //print a path
    if (bRet) {
        //print the solution
        printf("Solution is found\n");
    }
    else
        printf("Solution does not exist\n");

    fflush(NULL);

    delete planner;

    return bRet;
}